

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

void Gia_MiniAigSuperGates_rec(Mini_Aig_t *p,int iObj,Vec_Int_t *vRes,Vec_Int_t *vMap)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int Id;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)iObj;
  while( true ) {
    Id = (int)uVar4;
    iVar1 = Mini_AigNodeIsPi(p,Id);
    if (iVar1 != 0) {
      if ((-1 < Id) && (Id < vMap->nSize)) {
        if (-1 < vMap->pArray[uVar4]) {
          Vec_IntPush(vRes,vMap->pArray[uVar4]);
          return;
        }
        __assert_fail("Vec_IntEntry(vMap, iObj) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                      ,0x330,
                      "void Gia_MiniAigSuperGates_rec(Mini_Aig_t *, int, Vec_Int_t *, Vec_Int_t *)")
        ;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar2 = Mini_AigNodeFanin0(p,Id);
    uVar3 = Mini_AigNodeFanin1(p,Id);
    if ((int)uVar2 < 0) break;
    if ((uVar2 & 1) != 0) {
      __assert_fail("!Abc_LitIsCompl(iFan0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                    ,0x336,
                    "void Gia_MiniAigSuperGates_rec(Mini_Aig_t *, int, Vec_Int_t *, Vec_Int_t *)");
    }
    if ((int)uVar3 < 0) break;
    if ((uVar3 & 1) != 0) {
      __assert_fail("!Abc_LitIsCompl(iFan1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                    ,0x337,
                    "void Gia_MiniAigSuperGates_rec(Mini_Aig_t *, int, Vec_Int_t *, Vec_Int_t *)");
    }
    Gia_MiniAigSuperGates_rec(p,uVar2 >> 1,vRes,vMap);
    uVar4 = (ulong)(uVar3 >> 1);
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x130,"int Abc_LitIsCompl(int)");
}

Assistant:

void Gia_MiniAigSuperGates_rec( Mini_Aig_t * p, int iObj, Vec_Int_t * vRes, Vec_Int_t * vMap )
{
    int iFan0, iFan1;
    if ( Mini_AigNodeIsPi(p, iObj) )
    {
        assert( Vec_IntEntry(vMap, iObj) >= 0 );
        Vec_IntPush( vRes, Vec_IntEntry(vMap, iObj) );
        return;
    }
    iFan0 = Mini_AigNodeFanin0( p, iObj );
    iFan1 = Mini_AigNodeFanin1( p, iObj );
    assert( !Abc_LitIsCompl(iFan0) );
    assert( !Abc_LitIsCompl(iFan1) );
    Gia_MiniAigSuperGates_rec( p, Abc_Lit2Var(iFan0), vRes, vMap );
    Gia_MiniAigSuperGates_rec( p, Abc_Lit2Var(iFan1), vRes, vMap );
}